

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeGetBaseSafe(xmlDoc *doc,xmlNode *cur,xmlChar **baseOut)

{
  xmlChar **ppxVar1;
  int iVar2;
  bool bVar3;
  xmlEntityPtr ent;
  xmlChar *pxStack_40;
  int res;
  xmlChar *newbase;
  xmlChar *base;
  xmlChar *ret;
  xmlChar **baseOut_local;
  xmlNode *cur_local;
  xmlDoc *doc_local;
  
  base = (xmlChar *)0x0;
  if (baseOut == (xmlChar **)0x0) {
    doc_local._4_4_ = 1;
  }
  else {
    *baseOut = (xmlChar *)0x0;
    if ((cur == (xmlNode *)0x0) && (doc == (xmlDoc *)0x0)) {
      doc_local._4_4_ = 1;
    }
    else if ((cur == (xmlNode *)0x0) || (cur->type != XML_NAMESPACE_DECL)) {
      cur_local = (xmlNode *)doc;
      if (doc == (xmlDoc *)0x0) {
        cur_local = (xmlNode *)cur->doc;
      }
      ret = (xmlChar *)baseOut;
      baseOut_local = (xmlChar **)cur;
      if ((cur_local == (xmlNode *)0x0) || (cur_local->type != XML_HTML_DOCUMENT_NODE)) {
        for (; ppxVar1 = baseOut_local, baseOut_local != (xmlChar **)0x0;
            baseOut_local = (xmlChar **)baseOut_local[5]) {
          if (*(int *)(baseOut_local + 1) == 0x11) {
            if (baseOut_local[0xf] != (xmlChar *)0x0) {
              (*xmlFree)(base);
              base = xmlStrdup(ppxVar1[0xf]);
              if (base == (xmlChar *)0x0) {
                return -1;
              }
              goto LAB_0016ba3a;
            }
            break;
          }
          if (*(int *)(baseOut_local + 1) == 1) {
            iVar2 = xmlNodeGetAttrValue((xmlNode *)baseOut_local,"base",
                                        (xmlChar *)"http://www.w3.org/XML/1998/namespace",&newbase);
            if (iVar2 < 0) {
              (*xmlFree)(base);
              return -1;
            }
            if (newbase != (xmlChar *)0x0) {
              if (base == (xmlChar *)0x0) {
                base = newbase;
              }
              else {
                iVar2 = xmlBuildURISafe(base,newbase,&stack0xffffffffffffffc0);
                (*xmlFree)(base);
                (*xmlFree)(newbase);
                if (iVar2 != 0) {
                  return iVar2;
                }
                base = pxStack_40;
              }
              iVar2 = xmlStrncmp(base,(xmlChar *)"http://",7);
              if (((iVar2 == 0) || (iVar2 = xmlStrncmp(base,(xmlChar *)"ftp://",6), iVar2 == 0)) ||
                 (iVar2 = xmlStrncmp(base,(xmlChar *)"urn:",4), iVar2 == 0)) goto LAB_0016ba3a;
            }
          }
        }
        if ((cur_local != (xmlNode *)0x0) && (cur_local[1].name != (xmlChar *)0x0)) {
          if (base == (xmlChar *)0x0) {
            base = xmlStrdup(cur_local[1].name);
            if (base == (xmlChar *)0x0) {
              return -1;
            }
          }
          else {
            iVar2 = xmlBuildURISafe(base,cur_local[1].name,&stack0xffffffffffffffc0);
            (*xmlFree)(base);
            if (iVar2 != 0) {
              return iVar2;
            }
            base = pxStack_40;
          }
        }
      }
      else {
        baseOut_local = (xmlChar **)cur_local->children;
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                bVar3 = false;
                if (baseOut_local != (xmlChar **)0x0) {
                  bVar3 = baseOut_local[2] != (xmlChar *)0x0;
                }
                if (!bVar3) {
                  return 0;
                }
                if (*(int *)(baseOut_local + 1) == 1) break;
                baseOut_local = (xmlChar **)baseOut_local[6];
              }
              iVar2 = xmlStrcasecmp(baseOut_local[2],"html");
              if (iVar2 != 0) break;
              baseOut_local = (xmlChar **)baseOut_local[3];
            }
            iVar2 = xmlStrcasecmp(baseOut_local[2],"head");
            if (iVar2 != 0) break;
            baseOut_local = (xmlChar **)baseOut_local[3];
          }
          iVar2 = xmlStrcasecmp(baseOut_local[2],"base");
          if (iVar2 == 0) break;
          baseOut_local = (xmlChar **)baseOut_local[6];
        }
        iVar2 = xmlNodeGetAttrValue((xmlNode *)baseOut_local,"href",(xmlChar *)0x0,&base);
        if (iVar2 < 0) {
          return -1;
        }
        if (base == (xmlChar *)0x0) {
          return 1;
        }
      }
LAB_0016ba3a:
      *(xmlChar **)ret = base;
      doc_local._4_4_ = 0;
    }
    else {
      doc_local._4_4_ = 1;
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlNodeGetBaseSafe(const xmlDoc *doc, const xmlNode *cur, xmlChar **baseOut) {
    xmlChar *ret = NULL;
    xmlChar *base, *newbase;
    int res;

    if (baseOut == NULL)
        return(1);
    *baseOut = NULL;
    if ((cur == NULL) && (doc == NULL))
        return(1);
    if ((cur != NULL) && (cur->type == XML_NAMESPACE_DECL))
        return(1);
    if (doc == NULL)
        doc = cur->doc;

    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        cur = doc->children;
	while ((cur != NULL) && (cur->name != NULL)) {
	    if (cur->type != XML_ELEMENT_NODE) {
	        cur = cur->next;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "html")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "head")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "base")) {
                if (xmlNodeGetAttrValue(cur, BAD_CAST "href", NULL, &ret) < 0)
                    return(-1);
                if (ret == NULL)
                    return(1);
                goto found;
	    }
	    cur = cur->next;
	}
	return(0);
    }

    while (cur != NULL) {
	if (cur->type == XML_ENTITY_DECL) {
	    xmlEntityPtr ent = (xmlEntityPtr) cur;

            if (ent->URI == NULL)
                break;
            xmlFree(ret);
	    ret = xmlStrdup(ent->URI);
            if (ret == NULL)
                return(-1);
            goto found;
	}
	if (cur->type == XML_ELEMENT_NODE) {
	    if (xmlNodeGetAttrValue(cur, BAD_CAST "base", XML_XML_NAMESPACE,
                                    &base) < 0) {
                xmlFree(ret);
                return(-1);
            }
	    if (base != NULL) {
		if (ret != NULL) {
		    res = xmlBuildURISafe(ret, base, &newbase);
                    xmlFree(ret);
                    xmlFree(base);
                    if (res != 0)
                        return(res);
		    ret = newbase;
		} else {
		    ret = base;
		}
		if ((!xmlStrncmp(ret, BAD_CAST "http://", 7)) ||
		    (!xmlStrncmp(ret, BAD_CAST "ftp://", 6)) ||
		    (!xmlStrncmp(ret, BAD_CAST "urn:", 4)))
                    goto found;
	    }
	}
	cur = cur->parent;
    }

    if ((doc != NULL) && (doc->URL != NULL)) {
	if (ret == NULL) {
	    ret = xmlStrdup(doc->URL);
            if (ret == NULL)
                return(-1);
        } else {
            res = xmlBuildURISafe(ret, doc->URL, &newbase);
            xmlFree(ret);
            if (res != 0)
                return(res);
            ret = newbase;
        }
    }

found:
    *baseOut = ret;
    return(0);
}